

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_true>::insert_prefix_leaf(DaTrie<false,_true,_true> *this,Query *query)

{
  uint32_t uVar1;
  reference pvVar2;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  Query *in_stack_00000008;
  DaTrie<false,_true,_true> *in_stack_00000010;
  
  uVar1 = Query::node_pos(in_RSI);
  pvVar2 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar1);
  uVar1 = Bc::base(pvVar2);
  if (uVar1 == 0x7fffffff) {
    append_edge_(in_stack_00000010,in_stack_00000008);
  }
  else {
    insert_edge_(in_stack_00000010,in_stack_00000008);
  }
  uVar1 = Query::node_pos(in_RSI);
  pvVar2 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar1);
  uVar1 = Query::value(in_RSI);
  Bc::set_value(pvVar2,uVar1);
  return;
}

Assistant:

void insert_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(Prefix);

    if (bc_[query.node_pos()].base() != INVALID_VALUE) {
      insert_edge_(query);
    } else {
      append_edge_(query);
    }
    bc_[query.node_pos()].set_value(query.value());
  }